

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O2

long sd_supp(int child,long skip_count)

{
  advanceStream(0x21,skip_count,0);
  advanceStream(0x22,skip_count * 3,0);
  advanceStream(0x23,skip_count,0);
  advanceStream(0x20,skip_count * 9,0);
  advanceStream(0x24,skip_count * 2,0);
  advanceStream(0x2e,skip_count,0);
  advanceStream(0x2c,skip_count,0);
  advanceStream(0x2f,skip_count,0);
  advanceStream(0x2d,skip_count,0);
  return 0;
}

Assistant:

long
sd_supp(int child, DSS_HUGE skip_count)
{
   UNUSED(child);
   ADVANCE_STREAM(S_NTRG_SD, skip_count);
   ADVANCE_STREAM(S_PHNE_SD, 3L * skip_count);
   ADVANCE_STREAM(S_ABAL_SD, skip_count);
   ADVANCE_STREAM(S_ADDR_SD, skip_count * 9);
   ADVANCE_STREAM(S_CMNT_SD, skip_count * 2);
   ADVANCE_STREAM(BBB_CMNT_SD, skip_count);
   ADVANCE_STREAM(BBB_JNK_SD, skip_count);
   ADVANCE_STREAM(BBB_OFFSET_SD, skip_count);
   ADVANCE_STREAM(BBB_TYPE_SD, skip_count);      /* avoid one trudge */
   
   return(0L);
}